

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O3

void deqp::gles3::Functional::DepthStencilCaseUtil::render
               (vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                *clears,int viewportX,int viewportY)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  pointer pCVar4;
  
  glwEnable(0xc11);
  pCVar4 = (clears->
           super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(clears->
                              super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4) >> 3) *
          -0x33333333) {
    lVar2 = 0x24;
    lVar3 = 0;
    do {
      uVar1 = *(uint *)((long)(pCVar4->color).m_data + lVar2 + -0x28);
      if ((uVar1 >> 0xe & 1) != 0) {
        glwClearColor(*(GLfloat *)((long)(pCVar4->color).m_data + lVar2 + -0x24),
                      *(GLfloat *)((long)(&pCVar4->color + -2) + lVar2),
                      *(GLfloat *)((long)(pCVar4->color).m_data + lVar2 + -0x1c),
                      *(GLfloat *)((long)(pCVar4->color).m_data + lVar2 + -0x18));
        uVar1 = *(uint *)((long)(pCVar4->color).m_data + lVar2 + -0x28);
      }
      if ((uVar1 >> 10 & 1) != 0) {
        glwClearStencil(*(GLint *)((long)(pCVar4->color).m_data + lVar2 + -0x14));
      }
      glwScissor(*(int *)((long)(pCVar4->color).m_data + lVar2 + -0x38) + viewportX,
                 *(int *)((long)(pCVar4->color).m_data + lVar2 + -0x34) + viewportY,
                 *(GLsizei *)((long)(&pCVar4->color + -3) + lVar2),
                 *(GLsizei *)((long)(pCVar4->color).m_data + lVar2 + -0x2c));
      glwClear(*(GLbitfield *)((long)(pCVar4->color).m_data + lVar2 + -0x28));
      lVar3 = lVar3 + 1;
      pCVar4 = (clears->
               super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x28;
    } while (lVar3 < (int)((ulong)((long)(clears->
                                         super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4)
                          >> 3) * -0x33333333);
  }
  glwDisable(0xc11);
  return;
}

Assistant:

void render (const vector<ClearCommand>& clears, int viewportX, int viewportY)
{
	glEnable(GL_SCISSOR_TEST);

	for (int ndx = 0; ndx < (int)clears.size(); ndx++)
	{
		const ClearCommand& clear = clears[ndx];

		if (clear.buffers & GL_COLOR_BUFFER_BIT)	glClearColor(clear.color.x(), clear.color.y(), clear.color.z(), clear.color.w());
		if (clear.buffers & GL_STENCIL_BUFFER_BIT)	glClearStencil(clear.stencil);

		DE_ASSERT(clear.buffers == (clear.buffers & (GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))); // \note Don't use clear for depths.

		glScissor(clear.rect.left+viewportX, clear.rect.bottom+viewportY, clear.rect.width, clear.rect.height);
		glClear(clear.buffers);
	}

	glDisable(GL_SCISSOR_TEST);
}